

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom2snsf.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  size_t sVar7;
  mapped_type *pmVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  char *endptr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  char snsf_path [4096];
  char libname [4096];
  long local_20c0;
  char *local_20b8;
  key_type local_20a8;
  ulong local_2088;
  char *local_2080;
  char *local_2078;
  char **local_2070;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2068;
  char local_2038 [4];
  undefined2 auStack_2034 [2046];
  char local_1038 [4104];
  
  if (argc == 1) {
LAB_001047ed:
    usage(*argv);
  }
  else {
    local_2078 = (char *)0x0;
    local_20c0._0_4_ = 0;
    memset(local_2038,0,0x1000);
    memset(local_1038,0,0x1000);
    iVar9 = 1;
    if (argc < 2) {
      local_20b8 = (char *)0x0;
    }
    else {
      local_20c0 = 0;
      local_20b8 = (char *)0x0;
      do {
        pcVar6 = argv[iVar9];
        if (*pcVar6 != '-') break;
        iVar4 = strcmp(pcVar6,"--help");
        if (iVar4 == 0) goto LAB_001047ed;
        iVar4 = strcmp(pcVar6,"-o");
        if (iVar4 != 0) {
          iVar4 = strcmp(pcVar6,"--load");
          if (iVar4 == 0) {
            iVar4 = iVar9 + 1;
            if (iVar4 < argc) {
              local_20c0 = strtol(argv[iVar4],&local_2078,0x10);
              if (((*local_2078 != '\0') || (piVar5 = __errno_location(), *piVar5 == 0x22)) ||
                 (local_20c0 < 0)) {
                pcVar6 = argv[iVar4];
                pcVar11 = "Error: Number format error \"%s\"\n";
                goto LAB_00104ca1;
              }
              if (0x7fffff < (uint32_t)local_20c0) {
                fprintf(_stderr,"Error: Load offset too large 0x%08X\n",local_20c0);
                return 1;
              }
              goto LAB_001049ae;
            }
          }
          else {
            iVar4 = strcmp(pcVar6,"--lib");
            if (iVar4 == 0) {
              if (iVar9 + 1 < argc) {
                pcVar11 = argv[iVar9 + 1];
                pcVar6 = local_1038;
                goto LAB_001049a9;
              }
            }
            else {
              iVar4 = strcmp(pcVar6,"--psfby");
              if ((iVar4 != 0) && (iVar4 = strcmp(pcVar6,"--snsfby"), iVar4 != 0)) {
                pcVar11 = "Error: Unknown option \"%s\"\n";
                goto LAB_00104ca1;
              }
              if (iVar9 + 1 < argc) {
                local_20b8 = argv[iVar9 + 1];
                goto LAB_001049ae;
              }
            }
          }
LAB_00104c76:
          pcVar11 = "Error: Too few arguments for \"%s\"\n";
LAB_00104ca1:
          fprintf(_stderr,pcVar11,pcVar6);
          return 1;
        }
        if (argc <= iVar9 + 1) goto LAB_00104c76;
        pcVar11 = argv[iVar9 + 1];
        pcVar6 = local_2038;
LAB_001049a9:
        strcpy(pcVar6,pcVar11);
LAB_001049ae:
        iVar9 = iVar9 + 2;
      } while (iVar9 < argc);
    }
    if (argc == iVar9) {
      main_cold_2();
    }
    else {
      if ((argc - iVar9 < 2) || (local_2038[0] == '\0')) {
        uVar10 = 0;
        uVar13 = (ulong)(uint)(argc - iVar9);
        if (argc - iVar9 != 0 && iVar9 <= argc) {
          paVar1 = &local_20a8.field_2;
          local_2070 = argv + iVar9;
          lVar12 = 0;
          uVar10 = 0;
          local_2088 = uVar13;
          do {
            local_2080 = local_2070[lVar12];
            if (local_2038[0] == '\0') {
              strcpy(local_2038,local_2080);
              pcVar6 = path_findext(local_2038);
              cVar2 = local_1038[0];
              if (pcVar6 != (char *)0x0) {
                *pcVar6 = '\0';
              }
              sVar7 = strlen(local_2038);
              if (cVar2 == '\0') {
                *(undefined2 *)((long)auStack_2034 + sVar7) = 0x66;
                builtin_strncpy(local_2038 + sVar7,".sns",4);
              }
              else {
                builtin_strncpy(local_2038 + sVar7,".minisns",8);
                *(undefined2 *)((long)auStack_2034 + sVar7 + 4) = 0x66;
              }
            }
            local_2068._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_2068._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_2068._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_2068._M_impl.super__Rb_tree_header._M_header;
            local_2068._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_2068._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_2068._M_impl.super__Rb_tree_header._M_header._M_left;
            if (local_1038[0] != '\0') {
              local_20a8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_20a8,"_lib","");
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_2068,&local_20a8);
              pcVar6 = (char *)pmVar8->_M_string_length;
              strlen(local_1038);
              std::__cxx11::string::_M_replace((ulong)pmVar8,0,pcVar6,(ulong)local_1038);
              uVar13 = local_2088;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_20a8._M_dataplus._M_p != paVar1) {
                operator_delete(local_20a8._M_dataplus._M_p,
                                local_20a8.field_2._M_allocated_capacity + 1);
              }
            }
            if ((local_20b8 != (char *)0x0) && (*local_20b8 != '\0')) {
              local_20a8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_20a8,"snsfby","");
              pmVar8 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_2068,&local_20a8);
              pcVar6 = (char *)pmVar8->_M_string_length;
              strlen(local_20b8);
              std::__cxx11::string::_M_replace((ulong)pmVar8,0,pcVar6,(ulong)local_20b8);
              uVar13 = local_2088;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_20a8._M_dataplus._M_p != paVar1) {
                operator_delete(local_20a8._M_dataplus._M_p,
                                local_20a8.field_2._M_allocated_capacity + 1);
              }
            }
            bVar3 = rom2snsf(local_2080,local_2038,(uint32_t)local_20c0,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_2068);
            uVar10 = uVar10 + !bVar3;
            puts(local_2038);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&local_2068);
            lVar12 = lVar12 + 1;
          } while ((int)uVar13 != (int)lVar12);
        }
        if (uVar10 != 0) {
          fprintf(_stderr,"%d error(s)\n",(ulong)uVar10);
        }
        return (uint)(uVar10 != 0);
      }
      main_cold_1();
    }
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	uint32_t load_offset = 0;
	char snsf_path[PATH_MAX] = { '\0' };
	char libname[PATH_MAX] = { '\0' };

	char *psfby = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "-o") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(snsf_path, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--load") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			longval = strtol(argv[argi + 1], &endptr, 16);
			if (*endptr != '\0' || errno == ERANGE || longval < 0)
			{
				fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
				return EXIT_FAILURE;
			}
			load_offset = longval;

			if (load_offset >= SNES_ROM_MAX_SIZE) {
				fprintf(stderr, "Error: Load offset too large 0x%08X\n", load_offset);
				return EXIT_FAILURE;
			}

			argi++;
		}
		else if (strcmp(argv[argi], "--lib") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(libname, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--snsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];

			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	int argnum = argc - argi;
	if (argnum == 0) {
		fprintf(stderr, "Error: Too few arguments\n");
		return EXIT_FAILURE;
	}
	if (argnum > 1 && strcmp(snsf_path, "") != 0) {
		fprintf(stderr, "Error: Unable to specify output filename for multiple inputs\n");
		return EXIT_FAILURE;
	}

	int num_error = 0;
	for (; argi < argc; argi++) {
		const char * rom_path = argv[argi];
		const char * rom_ext = path_findext(rom_path);

		if (strcmp(snsf_path, "") == 0) {
			strcpy(snsf_path, rom_path);
			path_stripext(snsf_path);
			if (strcmp(libname, "") != 0) {
				strcat(snsf_path, ".minisnsf");
			}
			else {
				strcat(snsf_path, ".snsf");
			}
		}

		std::map<std::string, std::string> tags;
		if (strcmp(libname, "") != 0) {
			tags["_lib"] = libname;
		}

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["snsfby"] = psfby;
		}

		if (!rom2snsf(rom_path, snsf_path, load_offset, tags)) {
			num_error++;
		}

		puts(snsf_path);
	}

	if (num_error != 0) {
		fprintf(stderr, "%d error(s)\n", num_error);
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}